

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O0

vector<unsigned_long,_true> * __thiscall
duckdb::FunctionBinder::BindFunctionsFromArguments<duckdb::ScalarFunction>
          (FunctionBinder *this,string *name,FunctionSet<duckdb::ScalarFunction> *functions,
          vector<duckdb::LogicalType,_true> *arguments,ErrorData *error)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference this_00;
  optional_idx __x;
  value_type_conflict *__x_00;
  long in_RCX;
  vector<unsigned_long,_true> *in_RDI;
  ScalarFunction *f;
  iterator __end0;
  iterator __begin0;
  vector<duckdb::ScalarFunction,_true> *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  candidates;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_00000138;
  idx_t cost;
  optional_idx bind_cost;
  value_type *func;
  idx_t f_idx;
  idx_t lowest_cost;
  optional_idx best_function;
  vector<unsigned_long,_true> *candidate_functions;
  ErrorData *in_stack_fffffffffffffe48;
  ErrorData *in_stack_fffffffffffffe50;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  FunctionBinder *in_stack_fffffffffffffe98;
  ErrorData *in_stack_fffffffffffffea0;
  string local_d8 [32];
  reference local_b8;
  ScalarFunction *local_b0;
  __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
  local_a8;
  long local_a0;
  idx_t local_80;
  ErrorData *local_78;
  optional_idx local_70 [3];
  reference local_58;
  ulong local_50;
  byte local_41;
  ErrorData *local_40;
  optional_idx local_38 [3];
  long local_20;
  
  local_20 = in_RCX;
  optional_idx::optional_idx(local_38);
  local_40 = (ErrorData *)NumericLimits<unsigned_long>::Maximum();
  local_41 = 0;
  vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0x2a78b6d);
  for (local_50 = 0; uVar1 = local_50,
      sVar3 = ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::size
                        ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                         (local_20 + 0x20)), uVar1 < sVar3; local_50 = local_50 + 1) {
    this_00 = vector<duckdb::ScalarFunction,_true>::operator[]
                        ((vector<duckdb::ScalarFunction,_true> *)in_stack_fffffffffffffe50,
                         (size_type)in_stack_fffffffffffffe48);
    local_58 = this_00;
    __x = BindFunctionCost(in_stack_fffffffffffffe98,
                           (SimpleFunction *)
                           CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           in_stack_fffffffffffffe88);
    local_70[0] = __x;
    bVar2 = optional_idx::IsValid(local_70);
    if (bVar2) {
      in_stack_fffffffffffffe50 =
           (ErrorData *)
           optional_idx::GetIndex
                     ((optional_idx *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))
      ;
      local_78 = in_stack_fffffffffffffe50;
      if (in_stack_fffffffffffffe50 == local_40) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
                   (value_type_conflict *)__x.index);
      }
      else if (in_stack_fffffffffffffe50 <= local_40) {
        vector<unsigned_long,_true>::clear((vector<unsigned_long,_true> *)0x2a78c99);
        local_40 = local_78;
        optional_idx::optional_idx
                  ((optional_idx *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (idx_t)in_stack_fffffffffffffe88);
        local_38[0].index = local_80;
      }
    }
  }
  bVar2 = optional_idx::IsValid(local_38);
  if (bVar2) {
    __x_00 = (value_type_conflict *)
             optional_idx::GetIndex
                       ((optional_idx *)
                        CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe50,
               __x_00);
    local_41 = 1;
  }
  else {
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            *)0x2a78d0b);
    local_a0 = local_20 + 0x20;
    local_a8._M_current =
         (ScalarFunction *)
         ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::begin
                   ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                    in_stack_fffffffffffffe48);
    local_b0 = (ScalarFunction *)
               ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::end
                         ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *
                          )in_stack_fffffffffffffe48);
    while (bVar2 = __gnu_cxx::
                   operator!=<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                             ((__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                               *)in_stack_fffffffffffffe50,
                              (__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                               *)in_stack_fffffffffffffe48), bVar2) {
      local_b8 = __gnu_cxx::
                 __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                 ::operator*(&local_a8);
      (*(local_b8->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[2])
                (local_d8);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffe50,(value_type *)in_stack_fffffffffffffe48);
      ::std::__cxx11::string::~string(local_d8);
      __gnu_cxx::
      __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
      ::operator++(&local_a8);
    }
    BinderException::NoMatchingFunction
              ((string *)bind_cost.index,(vector<duckdb::LogicalType,_true> *)cost,in_stack_00000138
              );
    ErrorData::ErrorData(in_stack_fffffffffffffea0,(exception *)in_stack_fffffffffffffe98);
    ErrorData::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    ErrorData::~ErrorData(in_stack_fffffffffffffe50);
    BinderException::~BinderException((BinderException *)0x2a78e67);
    local_41 = 1;
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)0x2a78e84);
  }
  if ((local_41 & 1) == 0) {
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x2a78f04);
  }
  return in_RDI;
}

Assistant:

vector<idx_t> FunctionBinder::BindFunctionsFromArguments(const string &name, FunctionSet<T> &functions,
                                                         const vector<LogicalType> &arguments, ErrorData &error) {
	optional_idx best_function;
	idx_t lowest_cost = NumericLimits<idx_t>::Maximum();
	vector<idx_t> candidate_functions;
	for (idx_t f_idx = 0; f_idx < functions.functions.size(); f_idx++) {
		auto &func = functions.functions[f_idx];
		// check the arguments of the function
		auto bind_cost = BindFunctionCost(func, arguments);
		if (!bind_cost.IsValid()) {
			// auto casting was not possible
			continue;
		}
		auto cost = bind_cost.GetIndex();
		if (cost == lowest_cost) {
			candidate_functions.push_back(f_idx);
			continue;
		}
		if (cost > lowest_cost) {
			continue;
		}
		candidate_functions.clear();
		lowest_cost = cost;
		best_function = f_idx;
	}
	if (!best_function.IsValid()) {
		// no matching function was found, throw an error
		vector<string> candidates;
		for (auto &f : functions.functions) {
			candidates.push_back(f.ToString());
		}
		error = ErrorData(BinderException::NoMatchingFunction(name, arguments, candidates));
		return candidate_functions;
	}
	candidate_functions.push_back(best_function.GetIndex());
	return candidate_functions;
}